

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O3

IterateResult __thiscall
glcts::CoherentBlendTestCaseGroup::CoherentBlendTest::iterate(CoherentBlendTest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  pointer pbVar3;
  ContextInfo *pCVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  RenderContext *renderCtx;
  BlendStep *pBVar6;
  glUniform4fFunc p_Var7;
  uint uVar8;
  CoherentBlendTest *pCVar9;
  bool bVar10;
  int iVar11;
  GLenum GVar12;
  GLint GVar13;
  uint uVar14;
  undefined4 extraout_var;
  Functions *pFVar15;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var16;
  char *pcVar17;
  ulong uVar18;
  int *piVar19;
  ostream *poVar20;
  TestError *this_00;
  uint uVar21;
  uint uVar22;
  char cVar23;
  GLSLVersion glslVersion;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  uint uVar28;
  char cVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  char cVar33;
  char *extensionDirective;
  char cVar34;
  uint uVar35;
  long lVar36;
  uint uVar37;
  bool bVar38;
  Vec4 refCol;
  string frgSrc;
  FBOSentry fbo;
  ProgramSources sources;
  ShaderProgram p;
  allocator<char> local_392;
  allocator<char> local_391;
  CoherentBlendTest *local_390;
  undefined8 local_388;
  ulong local_380;
  undefined8 local_378;
  undefined8 uStack_370;
  string local_368;
  undefined8 local_348;
  undefined8 uStack_340;
  long local_330;
  value_type local_328;
  undefined1 local_308 [8];
  _Alloc_hider local_300;
  undefined1 local_2f8 [24];
  int local_2e0;
  VertexArrayPointer local_2d8;
  string local_2b8;
  FBOSentry local_298;
  undefined1 local_280 [8];
  undefined1 local_278 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268 [3];
  ios_base local_208 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f0;
  undefined1 local_1d0 [208];
  ShaderProgram local_100;
  undefined4 extraout_var_00;
  
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  local_330 = CONCAT44(extraout_var,iVar11);
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pFVar15 = (Functions *)CONCAT44(extraout_var_00,iVar11);
  pbVar3 = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pCVar4 = ((this->super_TestCase).m_context)->m_contextInfo;
  local_280 = (undefined1  [8])0x1b7fb06;
  _Var16 = std::
           __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                     ((pCVar4->m_extensions).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (pCVar4->m_extensions).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var16._M_current ==
      (pCVar4->m_extensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"GL_KHR_blend_equation_advanced");
  }
  else {
    pCVar4 = ((this->super_TestCase).m_context)->m_contextInfo;
    local_280 = (undefined1  [8])0x1b7fb25;
    _Var16 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                       ((pCVar4->m_extensions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (pCVar4->m_extensions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    pbVar5 = (pCVar4->m_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_378 = (pointer)0x0;
    uStack_370 = 0;
    extensionDirective = (char *)0x0;
    local_298.m_gl = pFVar15;
    FBOSentry::init(&local_298,(EVP_PKEY_CTX *)0x400);
    pcVar17 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
    GetSolidShader_abi_cxx11_
              (&local_2b8,(glcts *)"blend_support_all_equations",pcVar17,
               "#extension GL_KHR_blend_equation_advanced : require",extensionDirective);
    renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
    local_390 = this;
    GetDef2DVtxSrc_abi_cxx11_(&local_368,(glcts *)(ulong)this->m_glslVersion,glslVersion);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_308,local_368._M_dataplus._M_p,&local_391);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_328,local_2b8._M_dataplus._M_p,&local_392);
    memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_280,0,0xac);
    local_1d0._0_8_ = (pointer)0x0;
    local_1d0[8] = 0;
    local_1d0._9_7_ = 0;
    local_1d0[0x10] = 0;
    local_1d0._17_8_ = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_280,(value_type *)local_308);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_268,&local_328);
    glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_280);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d0);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_1f0);
    lVar26 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_280 + lVar26));
      lVar26 = lVar26 + -0x18;
    } while (lVar26 != -0x18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
    pCVar9 = local_390;
    local_388 = pbVar3;
    if ((undefined1 *)CONCAT44(local_308._4_4_,local_308._0_4_) != local_2f8) {
      operator_delete((undefined1 *)CONCAT44(local_308._4_4_,local_308._0_4_),local_2f8._0_8_ + 1);
    }
    paVar1 = &local_368.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != paVar1) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    if (local_100.m_program.m_info.linkOk == false) {
      glu::operator<<((TestLog *)local_388,&local_100);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                 ,0x2a7);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*pFVar15->useProgram)(local_100.m_program.m_program);
    GVar12 = (*pFVar15->getError)();
    glu::checkError(GVar12,"Program failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x2aa);
    local_368._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"aPos","");
    local_280._0_4_ = 1;
    local_278._0_8_ = local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_278,local_368._M_dataplus._M_p,
               local_368._M_dataplus._M_p + local_368._M_string_length);
    local_268[0].field_2._M_allocated_capacity._0_4_ = 0;
    local_308._0_4_ = local_280._0_4_;
    local_300._M_p = local_2f8 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_300,local_278._0_8_,
               (undefined1 *)
               ((long)&((_Alloc_hider *)local_278._8_8_)->_M_p +
               (long)&((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_278._0_8_)->_M_impl));
    local_2e0 = (undefined4)local_268[0].field_2._M_allocated_capacity;
    local_2d8.componentType = VTX_COMP_FLOAT;
    local_2d8.convert = VTX_COMP_CONVERT_NONE;
    local_2d8.numComponents = 2;
    local_2d8.numElements = 4;
    local_2d8.stride = 0;
    local_2d8.data = s_pos;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278._0_8_ !=
        local_268) {
      operator_delete((void *)local_278._0_8_,(ulong)(local_268[0]._M_dataplus._M_p + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != paVar1) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    (*pFVar15->disable)(0xbd0);
    (*pFVar15->enable)(0xbe2);
    (*pFVar15->clearColor)((GLfloat)local_378,local_378._4_4_,(GLfloat)uStack_370,uStack_370._4_4_);
    (*pFVar15->clear)(0x4000);
    if (_Var16._M_current == pbVar5) {
      (*pFVar15->blendBarrier)();
    }
    iVar11 = pCVar9->m_repeatCount;
    if (0 < iVar11) {
      uVar18 = (ulong)(uint)local_390->m_numSteps;
      uVar25 = 0;
      do {
        if (0 < (int)uVar18) {
          lVar26 = 0;
          lVar36 = 0;
          local_380 = uVar25;
          do {
            pBVar6 = local_390->m_steps;
            puVar2 = (undefined8 *)((long)pBVar6->src + lVar26);
            local_368._M_dataplus._M_p = (pointer)*puVar2;
            local_368._M_string_length = puVar2[1];
            local_348 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_368._M_dataplus._M_p;
            uStack_340 = local_368._M_string_length;
            Blend((glcts *)&local_328,*(GLenum *)((long)pBVar6->src + lVar26 + -4),
                  (Vec4 *)&local_368,(Vec4 *)&local_378);
            local_378 = local_328._M_dataplus._M_p;
            uStack_370 = local_328._M_string_length;
            (*pFVar15->blendEquation)(*(GLenum *)((long)pBVar6->src + lVar26 + -4));
            GVar12 = (*pFVar15->getError)();
            glu::checkError(GVar12,"BlendEquation failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                            ,0x2c6);
            p_Var7 = pFVar15->uniform4f;
            GVar13 = (*pFVar15->getUniformLocation)(local_100.m_program.m_program,"uSrcCol");
            (*p_Var7)(GVar13,(GLfloat)local_348,local_348._4_4_,(GLfloat)uStack_340,uStack_340._4_4_
                     );
            GVar12 = (*pFVar15->getError)();
            glu::checkError(GVar12,"Uniforms failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                            ,0x2ca);
            local_280 = (undefined1  [8])0x600000000;
            local_278._0_4_ = 1;
            local_278._8_8_ = s_indices;
            glu::draw(((local_390->super_TestCase).m_context)->m_renderCtx,
                      local_100.m_program.m_program,1,(VertexArrayBinding *)local_308,
                      (PrimitiveList *)local_280,(DrawUtilCallback *)0x0);
            GVar12 = (*pFVar15->getError)();
            glu::checkError(GVar12,"Draw failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                            ,0x2cf);
            if (_Var16._M_current == pbVar5) {
              (*pFVar15->blendBarrier)();
            }
            lVar36 = lVar36 + 1;
            uVar18 = (ulong)local_390->m_numSteps;
            lVar26 = lVar26 + 0x14;
          } while (lVar36 < (long)uVar18);
          iVar11 = local_390->m_repeatCount;
          uVar25 = local_380;
        }
        uVar24 = (int)uVar25 + 1;
        uVar25 = (ulong)uVar24;
      } while ((int)uVar24 < iVar11);
    }
    piVar19 = (int *)operator_new__(0x400000);
    (*pFVar15->readPixels)(0,0,0x400,0x400,0x1908,0x1401,piVar19);
    GVar12 = (*pFVar15->getError)();
    glu::checkError(GVar12,"Read pixels failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x2d9);
    local_348 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_348._4_4_,*piVar19);
    tcu::RGBA::RGBA((RGBA *)local_280,(Vec4 *)&local_378);
    cVar23 = (char)*(int *)(local_330 + 8);
    if (*(int *)(local_330 + 8) == 1) {
      uVar24 = (uint)(int)local_280[0] >> 7 & 0xff;
    }
    else {
      uVar24 = (local_280._0_4_ & 0xff) >> (8U - cVar23 & 0x1f);
      uVar24 = uVar24 >> (cVar23 * '\x02' - 8U & 0x1f) | uVar24 << (8U - cVar23 & 0x1f);
    }
    cVar29 = (char)*(int *)(local_330 + 0xc);
    if (*(int *)(local_330 + 0xc) == 1) {
      uVar35 = (uint)(int)local_280._0_2_ >> 0xf & 0xff;
    }
    else {
      uVar35 = ((uint)local_280._0_4_ >> 8 & 0xff) >> (8U - cVar29 & 0x1f);
      uVar35 = uVar35 >> (cVar29 * '\x02' - 8U & 0x1f) | uVar35 << (8U - cVar29 & 0x1f);
    }
    cVar33 = (char)*(int *)(local_330 + 0x10);
    if (*(int *)(local_330 + 0x10) == 1) {
      uVar27 = (int)(local_280._0_4_ << 8) >> 0x1f & 0xff;
    }
    else {
      uVar27 = ((uint)local_280._0_4_ >> 0x10 & 0xff) >> (8U - cVar33 & 0x1f);
      uVar27 = uVar27 >> (cVar33 * '\x02' - 8U & 0x1f) | uVar27 << (8U - cVar33 & 0x1f);
    }
    iVar11 = *(int *)(local_330 + 0x14);
    uVar21 = 0xff;
    cVar34 = (char)iVar11;
    if (iVar11 != 0) {
      if (iVar11 == 1) {
        uVar21 = (int)local_280._0_4_ >> 0x1f & 0xff;
      }
      else {
        uVar21 = ((uint)local_280._0_4_ >> 0x18) >> (8U - cVar34 & 0x1f);
        uVar21 = uVar21 >> (cVar34 * '\x02' - 8U & 0x1f) | uVar21 << (8U - cVar34 & 0x1f);
      }
    }
    uVar14 = uVar35 << 8 | uVar24;
    uVar27 = uVar27 << 0x10 | uVar21 << 0x18 | uVar14;
    uVar35 = 0;
    if (0 < iVar11) {
      uVar35 = 0x1000000 << (8U - cVar34 & 0x1f);
    }
    uVar37 = 0x100 << (8U - cVar29 & 0x1f) | 1 << ((byte)(8U - cVar23) & 0x1f);
    uVar35 = 0x10000 << (8U - cVar33 & 0x1f) | uVar37 | uVar35;
    uVar21 = 2 << (8U - cVar23 & 0x1f) & 0x1fe;
    if (0xfe < uVar21) {
      uVar21 = 0xff;
    }
    uVar37 = uVar37 >> 7 & 0x1fe;
    if (0xfe < uVar37) {
      uVar37 = 0xff;
    }
    uVar28 = uVar35 >> 0xf & 0x1fe;
    if (0xfe < uVar28) {
      uVar28 = 0xff;
    }
    uVar35 = uVar35 >> 0x17 & 0xfffffffe;
    if (0xfe < uVar35) {
      uVar35 = 0xff;
    }
    bVar38 = true;
    bVar10 = true;
    local_380 = CONCAT44(local_380._4_4_,uVar27);
    if ((GLfloat)uVar27 != (GLfloat)local_348) {
      uVar22 = (uVar24 & 0xff) - ((uint)(GLfloat)local_348 & 0xff);
      uVar8 = -uVar22;
      if (0 < (int)uVar22) {
        uVar8 = uVar22;
      }
      iVar30 = (uVar14 >> 8 & 0xff) - ((uint)(GLfloat)local_348 >> 8 & 0xff);
      iVar11 = -iVar30;
      if (0 < iVar30) {
        iVar11 = iVar30;
      }
      iVar31 = (uVar27 >> 0x10 & 0xff) - ((uint)(GLfloat)local_348 >> 0x10 & 0xff);
      iVar30 = -iVar31;
      if (0 < iVar31) {
        iVar30 = iVar31;
      }
      iVar32 = (uVar27 >> 0x18) - ((uint)(GLfloat)local_348 >> 0x18);
      iVar31 = -iVar32;
      if (0 < iVar32) {
        iVar31 = iVar32;
      }
      local_280._0_4_ = iVar30 << 0x10 | iVar11 << 8 | uVar8 | iVar31 << 0x18;
      bVar10 = tcu::RGBA::isBelowThreshold
                         ((RGBA *)local_280,
                          (RGBA)(uVar28 << 0x10 | uVar21 | uVar37 << 8 | uVar35 << 0x18));
    }
    lVar26 = 0;
    do {
      if (bVar38) {
        bVar38 = *piVar19 == *(int *)((long)piVar19 + lVar26);
      }
      else {
        bVar38 = false;
      }
      lVar26 = lVar26 + 4;
    } while (lVar26 != 0x3ff000);
    local_330 = CONCAT71(local_330._1_7_,bVar10 & bVar38);
    if ((bVar10 & bVar38) == 0) {
      local_280 = (undefined1  [8])local_388;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"Exceeds: ",9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"RGBA(",5);
      poVar20 = (ostream *)std::ostream::operator<<((ostringstream *)local_278,uVar21);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,uVar37);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,uVar28);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,uVar35);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,")",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," diff:",6);
      uVar27 = (uint)(GLfloat)local_348 & 0xff;
      uVar35 = (uVar24 & 0xff) - uVar27;
      uVar24 = -uVar35;
      if (0 < (int)uVar35) {
        uVar24 = uVar35;
      }
      uVar35 = (uint)(GLfloat)local_348 >> 8 & 0xff;
      iVar30 = (uVar14 >> 8 & 0xff) - uVar35;
      iVar11 = -iVar30;
      if (0 < iVar30) {
        iVar11 = iVar30;
      }
      local_388 = (pointer)(CONCAT44(local_388._4_4_,(uint)(GLfloat)local_348 >> 0x10) &
                           0xffffffff000000ff);
      iVar31 = ((uint)local_380 >> 0x10 & 0xff) - ((uint)(GLfloat)local_348 >> 0x10 & 0xff);
      iVar30 = -iVar31;
      if (0 < iVar31) {
        iVar30 = iVar31;
      }
      uVar21 = (uint)(GLfloat)local_348 >> 0x18;
      local_348 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_348._4_4_,uVar21);
      iVar32 = ((uint)local_380 >> 0x18) - uVar21;
      iVar31 = -iVar32;
      if (0 < iVar32) {
        iVar31 = iVar32;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"RGBA(",5);
      poVar20 = (ostream *)std::ostream::operator<<(local_278,uVar24);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
      uVar24 = iVar30 << 0x10 | uVar24 | iVar11 << 8 | iVar31 << 0x18;
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,uVar24 >> 8 & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,uVar24 >> 0x10 & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,uVar24 >> 0x18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,")",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"  res:",6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"RGBA(",5);
      poVar20 = (ostream *)std::ostream::operator<<(local_278,uVar27);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,uVar35);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,(int)local_388);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,(int)(GLfloat)local_348);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,")",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"  ref:",6);
      tcu::RGBA::RGBA((RGBA *)&local_368,(Vec4 *)&local_378);
      uVar24 = (uint)local_368._M_dataplus._M_p;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"RGBA(",5);
      poVar20 = (ostream *)std::ostream::operator<<((ostringstream *)local_278,uVar24 & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,uVar24 >> 8 & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,uVar24 >> 0x10 & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,uVar24 >> 0x18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
      std::ios_base::~ios_base(local_208);
      pcVar17 = "Fail (results differ)";
    }
    else {
      pcVar17 = "Pass";
    }
    operator_delete__(piVar19);
    tcu::TestContext::setTestResult
              ((local_390->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (uint)((byte)local_330 ^ 1),pcVar17);
    if (local_300._M_p != local_2f8 + 8) {
      operator_delete(local_300._M_p,local_2f8._8_8_ + 1);
    }
    glu::ShaderProgram::~ShaderProgram(&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    FBOSentry::~FBOSentry(&local_298);
  }
  return STOP;
}

Assistant:

CoherentBlendTestCaseGroup::CoherentBlendTest::IterateResult CoherentBlendTestCaseGroup::CoherentBlendTest::iterate(
	void)
{
	static const int		 dim = 1024;
	const tcu::RenderTarget& rt  = m_context.getRenderContext().getRenderTarget();
	const tcu::PixelFormat&  pf  = rt.getPixelFormat();
	const glw::Functions&	gl  = m_context.getRenderContext().getFunctions();
	TestLog&				 log = m_testCtx.getLog();

	// Check that extension is supported.
	if (!IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_KHR_blend_equation_advanced");
		return STOP;
	}

	bool needBarrier = !IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced_coherent");

	tcu::Vec4 dstCol(0.f, 0.f, 0.f, 0.f);

	FBOSentry fbo(gl, dim, dim, GL_RGBA8);

	// Setup progra
	std::string frgSrc = GetSolidShader("blend_support_all_equations", glu::getGLSLVersionDeclaration(m_glslVersion));
	glu::ShaderProgram p(m_context.getRenderContext(),
						 glu::makeVtxFragSources(GetDef2DVtxSrc(m_glslVersion).c_str(), frgSrc.c_str()));
	if (!p.isOk())
	{
		log << p;
		TCU_FAIL("Compile failed");
	}
	gl.useProgram(p.getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Program failed");

	glu::VertexArrayBinding posBinding = glu::va::Float("aPos", 2, 4, 0, &s_pos[0]);

	// Enable blending.
	gl.disable(GL_DITHER);
	gl.enable(GL_BLEND);

	// Clear.
	gl.clearColor(dstCol[0], dstCol[1], dstCol[2], dstCol[3]);
	gl.clear(GL_COLOR_BUFFER_BIT);

	// Blend barrier.
	if (needBarrier)
		gl.blendBarrier();

	// Repeat block.
	for (int i = 0; i < m_repeatCount; i++)
		// Loop blending steps.
		for (int j = 0; j < m_numSteps; j++)
		{
			const BlendStep& s = m_steps[j];
			tcu::Vec4		 srcCol(s.src[0], s.src[1], s.src[2], s.src[3]);
			tcu::Vec4		 refCol = Blend(s.mode, srcCol, dstCol);
			dstCol					= refCol;

			// Set blend equation.
			gl.blendEquation(s.mode);
			GLU_EXPECT_NO_ERROR(gl.getError(), "BlendEquation failed");

			// Set source color.
			gl.uniform4f(gl.getUniformLocation(p.getProgram(), "uSrcCol"), srcCol[0], srcCol[1], srcCol[2], srcCol[3]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Uniforms failed");

			// Draw.
			glu::draw(m_context.getRenderContext(), p.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(s_indices), &s_indices[0]));
			GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");

			// Blend barrier.
			if (needBarrier)
				gl.blendBarrier();
		}

	// Read the results.
	glw::GLubyte* result = new glw::GLubyte[4 * dim * dim];
	gl.readPixels(0, 0, dim, dim, GL_RGBA, GL_UNSIGNED_BYTE, result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels failed");

	// Check that first pixel is ok.
	tcu::RGBA res		= tcu::RGBA::fromBytes(result);
	tcu::RGBA ref		= pf.convertColor(tcu::RGBA(dstCol));
	tcu::RGBA threshold = pf.getColorThreshold() + pf.getColorThreshold();
	bool	  firstOk   = tcu::compareThreshold(ref, res, threshold);

	// Check that all pixels are the same as the first one.
	bool allSame = true;
	for (int i = 0; i < dim * (dim - 1); i++)
		allSame = allSame && (0 == memcmp(result, result + (i * 4), 4));

	bool pass = firstOk && allSame;
	if (!pass)
	{
		log << TestLog::Message << "Exceeds: " << threshold << " diff:" << tcu::computeAbsDiff(ref, res)
			<< "  res:" << res << "  ref:" << tcu::RGBA(dstCol) << TestLog::EndMessage;
	}

	delete[] result;

	m_testCtx.setTestResult(pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, pass ? "Pass" : "Fail (results differ)");
	return STOP;
}